

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

DynamicType *
Js::JavascriptOperators::EnsureObjectLiteralType
          (ScriptContext *scriptContext,PropertyIdArray *propIds,Type *literalType)

{
  code *pcVar1;
  DynamicType *pDVar2;
  bool bVar3;
  uint16 uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ThreadContext *threadContext;
  DynamicType **ppDVar8;
  JavascriptLibrary *pJVar9;
  uint *puVar10;
  undefined4 *puVar11;
  DynamicTypeHandler *pDVar12;
  DynamicType *local_90;
  uint local_64;
  DynamicType *local_60;
  DynamicType *objectType;
  DynamicType *local_48;
  DynamicType *newType;
  JsReentLock reentrancylock;
  Type *literalType_local;
  PropertyIdArray *propIds_local;
  ScriptContext *scriptContext_local;
  
  reentrancylock._24_8_ = literalType;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&newType,threadContext);
  ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)reentrancylock._24_8_);
  local_48 = *ppDVar8;
  if (local_48 == (DynamicType *)0x0) {
    bVar3 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    if (bVar3) {
      pJVar9 = ScriptContext::GetLibrary(scriptContext);
      local_90 = JavascriptLibrary::GetObjectHeaderInlinedLiteralType(pJVar9,(uint16)propIds->count)
      ;
    }
    else {
      pJVar9 = ScriptContext::GetLibrary(scriptContext);
      local_64 = 0x10;
      puVar10 = min<unsigned_int>(&propIds->count,&local_64);
      local_90 = JavascriptLibrary::GetObjectLiteralType(pJVar9,(uint16)*puVar10);
    }
    local_60 = local_90;
    local_48 = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext,local_90,propIds,false);
    Memory::WriteBarrierPtr<Js::DynamicType>::operator=
              ((WriteBarrierPtr<Js::DynamicType> *)reentrancylock._24_8_,local_48);
  }
  else {
    bVar3 = DynamicType::GetIsShared(local_48);
    if (!bVar3) {
      DynamicType::ShareType(local_48);
    }
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16fd,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  uVar5 = GetLiteralInlineSlotCapacity(propIds);
  pDVar12 = DynamicType::GetTypeHandler(local_48);
  uVar4 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar12);
  if (uVar5 != uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16fe,
                                "(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pDVar12 = DynamicType::GetTypeHandler(local_48);
  iVar6 = DynamicTypeHandler::GetSlotCapacity(pDVar12);
  if (iVar6 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16ff,"(newType->GetTypeHandler()->GetSlotCapacity() >= 0)",
                                "newType->GetTypeHandler()->GetSlotCapacity() >= 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  uVar5 = GetLiteralSlotCapacity(propIds);
  pDVar12 = DynamicType::GetTypeHandler(local_48);
  uVar7 = DynamicTypeHandler::GetSlotCapacity(pDVar12);
  if (uVar5 != uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1700,
                                "(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity())"
                                ,
                                "GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pDVar2 = local_48;
  JsReentLock::~JsReentLock((JsReentLock *)&newType);
  return pDVar2;
}

Assistant:

DynamicType *
    JavascriptOperators::EnsureObjectLiteralType(ScriptContext* scriptContext, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(EnsureObjectLiteralType, reentrancylock, scriptContext->GetThreadContext());
        DynamicType * newType = *literalType;
        if (newType != nullptr)
        {
            if (!newType->GetIsShared())
            {
                newType->ShareType();
            }
        }
        else
        {
            DynamicType* objectType =
                FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                    ?   scriptContext->GetLibrary()->GetObjectHeaderInlinedLiteralType((uint16)propIds->count)
                    :   scriptContext->GetLibrary()->GetObjectLiteralType(
                            static_cast<PropertyIndex>(
                                min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
            newType = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext, objectType, propIds, false);
            *literalType = newType;
        }

        Assert(scriptContext);
        Assert(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(newType->GetTypeHandler()->GetSlotCapacity() >= 0);
        Assert(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity());
        return newType;
        JIT_HELPER_END(EnsureObjectLiteralType);
    }